

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogPipe.cpp
# Opt level: O3

void __thiscall liblogger::LogPipe::Log(LogPipe *this,LogType Type,string *str)

{
  FILE *__stream;
  pointer pcVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  string *psVar5;
  ostream *poVar6;
  int *piVar7;
  char *pcVar8;
  LogException *pLVar9;
  time_t current;
  stringstream ss;
  tm timeinfo;
  char buf [128];
  string local_290;
  time_t local_270;
  undefined1 local_268 [392];
  tm local_e0;
  char local_a8 [128];
  
  if (this->m_fp == (FILE *)0x0) {
    pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
    local_268._0_8_ = local_268 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"Pipe not open","");
    LogException::LogException(pLVar9,(string *)local_268);
    __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
  }
  local_270 = time((time_t *)0x0);
  localtime_r(&local_270,&local_e0);
  sVar4 = strftime(local_a8,0x80,"%F %T",&local_e0);
  if (sVar4 == 0) {
    abort();
  }
  __stream = (FILE *)this->m_fp;
  psVar5 = LogTypeToStr_abi_cxx11_(Type);
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  uVar2 = getpid();
  iVar3 = fprintf(__stream,"%s - %s [PID: %d] - %s\n",local_a8,pcVar1,(ulong)uVar2,
                  (str->_M_dataplus)._M_p);
  if (iVar3 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_268);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_268 + 0x10),"failed to write to pipe \'",0x19);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_268 + 0x10),(this->m_command)._M_dataplus._M_p,
                        (this->m_command)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' error:",8);
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    std::operator<<(poVar6,pcVar8);
    pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar9,&local_290);
    __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
  }
  iVar3 = fflush((FILE *)this->m_fp);
  if (-1 < iVar3) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_268);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_268 + 0x10),"failed to flush to pipe \'",0x19);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_268 + 0x10),(this->m_command)._M_dataplus._M_p,
                      (this->m_command)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' error:",8);
  piVar7 = __errno_location();
  pcVar8 = strerror(*piVar7);
  std::operator<<(poVar6,pcVar8);
  pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(pLVar9,&local_290);
  __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void LogPipe::Log(const LogType Type, const std::string &str) {
	if (m_fp == NULL)
		throw(LogException("Pipe not open"));

	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	if (strftime(buf, sizeof(buf), "%F %T", &timeinfo) == 0)
		abort(); //Bug

	if (fprintf(m_fp, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "failed to write to pipe '" << m_command << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
	if (fflush(m_fp) < 0)
	{
		std::stringstream ss;
		ss << "failed to flush to pipe '" << m_command << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}